

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O0

void __thiscall ByteSwapper_All_Test::TestBody(ByteSwapper_All_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_98;
  Message local_90;
  int local_88;
  uint16_t local_82;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_2;
  Message local_68;
  int local_60;
  uint16_t local_5a;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  Message local_40 [3];
  int local_28;
  uint16_t local_22;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  ByteSwapper_All_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_22 = pstore::utf::byte_swapper(0xff);
  local_28 = 0xff00;
  testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
            ((EqHelper *)local_20,"pstore::utf::byte_swapper (0x00FF)","0xFF00",&local_22,&local_28)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x128,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_5a = pstore::utf::byte_swapper(0xff00);
  local_60 = 0xff;
  testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
            ((EqHelper *)local_58,"pstore::utf::byte_swapper (0xFF00)","0x00FF",&local_5a,&local_60)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x129,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_82 = pstore::utf::byte_swapper(0x1234);
  local_88 = 0x3412;
  testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
            ((EqHelper *)local_80,"pstore::utf::byte_swapper (0x1234)","0x3412",&local_82,&local_88)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x12a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  return;
}

Assistant:

TEST (ByteSwapper, All) {
    EXPECT_EQ (pstore::utf::byte_swapper (0x00FF), 0xFF00);
    EXPECT_EQ (pstore::utf::byte_swapper (0xFF00), 0x00FF);
    EXPECT_EQ (pstore::utf::byte_swapper (0x1234), 0x3412);
}